

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  string *psVar4;
  salsa_file_wrapper sfw;
  string out_file_name;
  string in_file_name;
  string key;
  salsa_file_wrapper sStack_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
switchD_0010243d_caseD_6a:
  while( true ) {
    iVar3 = getopt(argc,argv,"i:o:k:vh");
    pcVar2 = _optarg;
    if (iVar3 - 0x68U < 8) break;
    if (iVar3 == -1) {
      if (((local_70._M_string_length == 0) || (local_90._M_string_length == 0)) ||
         (local_b0._M_string_length == 0)) {
        print_help();
      }
      else {
        salsa_file_wrapper::salsa_file_wrapper(&sStack_b8);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"99990001","");
        salsa_file_wrapper::set_key_and_nonce(&sStack_b8,&local_70,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        salsa_file_wrapper::crypt_file(&sStack_b8,&local_90,&local_b0,true);
        salsa_file_wrapper::~salsa_file_wrapper(&sStack_b8);
      }
      goto LAB_00102485;
    }
    if (iVar3 == 0x76) goto switchD_0010243d_caseD_68;
  }
  psVar4 = &local_b0;
  switch(iVar3) {
  case 0x68:
    goto switchD_0010243d_caseD_68;
  case 0x69:
    psVar4 = &local_90;
    break;
  default:
    goto switchD_0010243d_caseD_6a;
  case 0x6b:
    psVar4 = &local_70;
    break;
  case 0x6f:
    break;
  }
  pcVar1 = (char *)psVar4->_M_string_length;
  strlen(_optarg);
  std::__cxx11::string::_M_replace((ulong)psVar4,0,pcVar1,(ulong)pcVar2);
  goto switchD_0010243d_caseD_6a;
switchD_0010243d_caseD_68:
  print_help();
LAB_00102485:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,
                    CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                             local_b0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    (void)argc;
    (void)argv;

    std::string key;

    std::string in_file_name;
    std::string out_file_name;

    int c = 0;
    while ((c = getopt(argc, argv, "i:o:k:vh")) != -1)
    {
        switch (c)
        {
        case 'i': in_file_name = optarg;
            break;
        case 'o': out_file_name = optarg;
            break;
        case 'k': key = optarg;
            break;
        case 'v':
        case 'h':
            print_help();
            return 0;
        }
    }

    bool strings_is_ready = true;
    strings_is_ready &= !key.empty();
    strings_is_ready &= !in_file_name.empty();
    strings_is_ready &= !out_file_name.empty();

    if (strings_is_ready)
    {
        salsa_file_wrapper sfw;
        sfw.set_key_and_nonce(key, c_nonce);
        sfw.crypt_file(in_file_name, out_file_name, true);
    }
    else
    {
        print_help();
    }

    return 0;
}